

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

void amrex::parser_ast_regvar(parser_node *node,char *name,int i)

{
  int iVar1;
  Print *x;
  char *msg;
  int in_EDX;
  parser_node *in_RSI;
  int *in_RDI;
  ostream *in_stack_fffffffffffffe28;
  Print *this;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  msg = (char *)(ulong)(*in_RDI - 1);
  switch(msg) {
  case (char *)0x0:
    break;
  case (char *)0x1:
    iVar1 = strcmp((char *)in_RSI,*(char **)(in_RDI + 2));
    if (iVar1 == 0) {
      in_RDI[4] = in_EDX;
    }
    break;
  case (char *)0x2:
  case (char *)0x3:
  case (char *)0x4:
  case (char *)0x5:
  case (char *)0xb:
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    break;
  case (char *)0x6:
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    break;
  case (char *)0x7:
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    break;
  case (char *)0x8:
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    break;
  case (char *)0x9:
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    break;
  case (char *)0xa:
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    break;
  case (char *)0xc:
  case (char *)0xe:
  case (char *)0x10:
  case (char *)0x12:
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    in_RDI[8] = *(int *)(*(long *)(in_RDI + 4) + 0x10);
    break;
  case (char *)0xd:
  case (char *)0xf:
  case (char *)0x11:
  case (char *)0x13:
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    in_RDI[6] = *(int *)(*(long *)(in_RDI + 2) + 0x10);
    in_RDI[8] = *(int *)(*(long *)(in_RDI + 4) + 0x10);
    break;
  case (char *)0x14:
    parser_ast_regvar(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
    in_RDI[6] = *(int *)(*(long *)(in_RDI + 2) + 0x10);
    break;
  default:
    OutStream();
    this = (Print *)&stack0xfffffffffffffe58;
    AllPrint::AllPrint((AllPrint *)this,in_stack_fffffffffffffe28);
    Print::operator<<(this,(char (*) [38])in_stack_fffffffffffffe28);
    x = Print::operator<<(this,(parser_node_t *)in_stack_fffffffffffffe28);
    Print::operator<<(this,(char (*) [2])x);
    AllPrint::~AllPrint((AllPrint *)0x18c676e);
    Abort_host(msg);
  }
  return;
}

Assistant:

void
parser_ast_regvar (struct parser_node* node, char const* name, int i)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
        break;
    case PARSER_SYMBOL:
        if (std::strcmp(name, ((struct parser_symbol*)node)->name) == 0) {
            ((struct parser_symbol*)node)->ip = i;
        }
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_LIST:
        parser_ast_regvar(node->l, name, i);
        parser_ast_regvar(node->r, name, i);
        break;
    case PARSER_NEG:
        parser_ast_regvar(node->l, name, i);
        break;
    case PARSER_F1:
        parser_ast_regvar(((struct parser_f1*)node)->l, name, i);
        break;
    case PARSER_F2:
        parser_ast_regvar(((struct parser_f2*)node)->l, name, i);
        parser_ast_regvar(((struct parser_f2*)node)->r, name, i);
        break;
    case PARSER_F3:
        parser_ast_regvar(((struct parser_f3*)node)->n1, name, i);
        parser_ast_regvar(((struct parser_f3*)node)->n2, name, i);
        parser_ast_regvar(((struct parser_f3*)node)->n3, name, i);
        break;
    case PARSER_ASSIGN:
        parser_ast_regvar(((struct parser_assign*)node)->v, name, i);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        parser_ast_regvar(node->r, name, i);
        node->rip = ((struct parser_symbol*)(node->r))->ip;
        break;
    case PARSER_NEG_P:
        parser_ast_regvar(node->l, name, i);
        node->lvp.ip = ((struct parser_symbol*)(node->l))->ip;
        break;
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
        parser_ast_regvar(node->l, name, i);
        parser_ast_regvar(node->r, name, i);
        node->lvp.ip = ((struct parser_symbol*)(node->l))->ip;
        node->rip = ((struct parser_symbol*)(node->r))->ip;
        break;
    default:
        amrex::AllPrint() << "parser_ast_regvar: unknown node type " << node->type << "\n";
        amrex::Abort();
    }
}